

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk64(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk64 *peVar4;
  envy_bios_power_unk64_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk64 *unk64;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk64;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk64.version);
    if ((bios->power).unk64.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk64.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk64.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk64.entriesnum);
      (bios->power).unk64.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk64_entry *)malloc((ulong)(bios->power).unk64.entriesnum << 2);
      (bios->power).unk64.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk64.entriesnum; data = data + 1) {
        (bios->power).unk64.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk64.hlen + data * (bios->power).unk64.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown FAN TEST table version 0x%x\n",(ulong)(bios->power).unk64.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk64(struct envy_bios *bios) {
	struct envy_bios_power_unk64 *unk64 = &bios->power.unk64;
	int i, err = 0;

	if (!unk64->offset)
		return -EINVAL;

	bios_u8(bios, unk64->offset + 0x0, &unk64->version);
	switch(unk64->version) {
	case 0x10:
		err |= bios_u8(bios, unk64->offset + 0x1, &unk64->hlen);
		err |= bios_u8(bios, unk64->offset + 0x2, &unk64->rlen);
		err |= bios_u8(bios, unk64->offset + 0x3, &unk64->entriesnum);
		unk64->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN TEST table version 0x%x\n", unk64->version);
		return -EINVAL;
	};

	err = 0;
	unk64->entries = malloc(unk64->entriesnum * sizeof(struct envy_bios_power_unk64_entry));
	for (i = 0; i < unk64->entriesnum; i++) {
		uint32_t data = unk64->offset + unk64->hlen + i * unk64->rlen;

		unk64->entries[i].offset = data;
	}

	return 0;
}